

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int katherine_set_bias(katherine_device_t *device,uchar bias_id,float bias_value)

{
  int iVar1;
  char ack [8];
  float local_18;
  undefined4 uStack_14;
  
  iVar1 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar1 == 0) {
    _local_18 = CONCAT44(0x20000,bias_value);
    iVar1 = katherine_udp_send_exact(&device->control_socket,&local_18,8);
    if (iVar1 == 0) {
      iVar1 = katherine_udp_recv_exact(&device->control_socket,&local_18,8);
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar1;
}

Assistant:

int
katherine_set_bias(katherine_device_t *device, unsigned char bias_id, float bias_value)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    // TODO use bias_id

    res = katherine_cmd_set_bias_settings(&device->control_socket, bias_value);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}